

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_xform_dc_only(MACROBLOCK *x,int plane,int block,TxfmParam *txfm_param,int64_t per_px_mean)

{
  int iVar1;
  undefined4 *__s;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int n_coeffs;
  tran_low_t *coeff;
  int block_offset;
  macroblock_plane *p;
  
  __s = (undefined4 *)(*(long *)(in_RDI + (long)in_ESI * 0x88 + 0x18) + (long)(in_EDX << 4) * 4);
  iVar1 = av1_get_max_eob(*(TX_SIZE *)(in_RCX + 1));
  memset(__s,0,(long)iVar1 << 2);
  *__s = (int)((long)(in_R8 * (ulong)dc_coeff_scale[*(byte *)(in_RCX + 1)]) >> 0xc);
  return;
}

Assistant:

void av1_xform_dc_only(MACROBLOCK *x, int plane, int block,
                       TxfmParam *txfm_param, int64_t per_px_mean) {
  assert(per_px_mean != INT64_MAX);
  const struct macroblock_plane *const p = &x->plane[plane];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *const coeff = p->coeff + block_offset;
  const int n_coeffs = av1_get_max_eob(txfm_param->tx_size);
  memset(coeff, 0, sizeof(*coeff) * n_coeffs);
  coeff[0] =
      (tran_low_t)((per_px_mean * dc_coeff_scale[txfm_param->tx_size]) >> 12);
}